

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint ON_SubDEdgeChain::RefineEdgeChains
               (ON_SimpleArray<ON_SubDEdgePtr> *unconditional_edge_chains,bool bOrdinarySmoothChains
               ,bool bOrdinaryCreaseChains,ON_SimpleArray<ON_SubDEdgePtr> *refined_edge_chains)

{
  unsigned_short uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  ON_SubDEdgePtr *pOVar5;
  ON_SubDEdgePtr *pOVar6;
  ON_SubDEdge *this;
  ON_SubDVertex *this_00;
  double dVar7;
  double dVar8;
  uint local_c4;
  bool local_ad;
  ON_SubDVertex *v;
  ON_SubDEdgeSharpness s;
  ON_SubDEdge *e;
  ON_SubDEdgePtr eptr;
  float fStack_78;
  ON_SubDEdgeSharpness prev_sharpness;
  bool bSharpChain;
  bool bSmoothChain;
  unsigned_short edge_face_count;
  ON_SubDEdge *e0;
  ON_SubDEdgePtr eptr0;
  uint i0;
  uint i1;
  uint refined_chain_count;
  undefined1 local_48 [8];
  ON_SimpleArray<ON_SubDEdgePtr> local_unconditional_edge_chains;
  uint unconditional_edge_count;
  ON_SimpleArray<ON_SubDEdgePtr> *refined_edge_chains_local;
  bool bOrdinaryCreaseChains_local;
  bool bOrdinarySmoothChains_local;
  ON_SimpleArray<ON_SubDEdgePtr> *unconditional_edge_chains_local;
  
  local_unconditional_edge_chains.m_capacity =
       ON_SimpleArray<ON_SubDEdgePtr>::UnsignedCount(unconditional_edge_chains);
  if (local_unconditional_edge_chains.m_capacity != 0) {
    pOVar5 = ON_SimpleArray<ON_SubDEdgePtr>::Array(unconditional_edge_chains);
    pOVar6 = ON_SimpleArray<ON_SubDEdgePtr>::Array(refined_edge_chains);
    if (pOVar5 == pOVar6) {
      ON_SimpleArray<ON_SubDEdgePtr>::ON_SimpleArray
                ((ON_SimpleArray<ON_SubDEdgePtr> *)local_48,unconditional_edge_chains);
      ON_SimpleArray<ON_SubDEdgePtr>::SetCount(refined_edge_chains,0);
      uVar4 = RefineEdgeChains((ON_SimpleArray<ON_SubDEdgePtr> *)local_48,bOrdinarySmoothChains,
                               bOrdinaryCreaseChains,refined_edge_chains);
      ON_SimpleArray<ON_SubDEdgePtr>::~ON_SimpleArray((ON_SimpleArray<ON_SubDEdgePtr> *)local_48);
      return uVar4;
    }
  }
  uVar4 = ON_SimpleArray<ON_SubDEdgePtr>::UnsignedCount(refined_edge_chains);
  if (uVar4 != 0) {
    pOVar5 = ON_SimpleArray<ON_SubDEdgePtr>::Last(refined_edge_chains);
    bVar2 = ON_SubDEdgePtr::IsNotNull(pOVar5);
    if (bVar2) {
      ON_SimpleArray<ON_SubDEdgePtr>::Append(refined_edge_chains,&ON_SubDEdgePtr::Null);
    }
  }
  i0 = 0;
  eptr0.m_ptr._4_4_ = 0;
  eptr0.m_ptr._0_4_ = 0;
  do {
    if ((uint)local_unconditional_edge_chains.m_capacity <= (uint)eptr0.m_ptr) {
      return i0;
    }
    pOVar5 = ON_SimpleArray<ON_SubDEdgePtr>::operator[](unconditional_edge_chains,(uint)eptr0.m_ptr)
    ;
    e0 = (ON_SubDEdge *)pOVar5->m_ptr;
    this = ON_SubDEdgePtr::Edge((ON_SubDEdgePtr *)&e0);
    if (this != (ON_SubDEdge *)0x0) {
      ON_SimpleArray<ON_SubDEdgePtr>::Append(refined_edge_chains,(ON_SubDEdgePtr *)&e0);
      uVar1 = this->m_face_count;
      bVar2 = ON_SubDEdge::IsSmooth(this);
      if (bVar2) {
        local_ad = ON_SubDEdge::IsSharp(this);
      }
      else {
        local_ad = false;
      }
      if (local_ad == false) {
        eptr.m_ptr._4_4_ = 0.0;
        fStack_78 = 0.0;
        eptr0.m_ptr._4_4_ = (uint)eptr0.m_ptr;
      }
      else {
        register0x00001200 = ON_SubDEdgePtr::RelativeSharpness((ON_SubDEdgePtr *)&e0,false);
        eptr0.m_ptr._4_4_ = (uint)eptr0.m_ptr;
      }
      do {
        while( true ) {
          eptr0.m_ptr._4_4_ = eptr0.m_ptr._4_4_ + 1;
          if ((uint)local_unconditional_edge_chains.m_capacity <= eptr0.m_ptr._4_4_)
          goto LAB_008ac944;
          pOVar5 = ON_SimpleArray<ON_SubDEdgePtr>::operator[]
                             (unconditional_edge_chains,eptr0.m_ptr._4_4_);
          e = (ON_SubDEdge *)pOVar5->m_ptr;
          s.m_edge_sharpness = (float  [2])ON_SubDEdgePtr::Edge((ON_SubDEdgePtr *)&e);
          if (((s.m_edge_sharpness == (float  [2])0x0) ||
              (uVar1 != *(unsigned_short *)((long)s.m_edge_sharpness + 100))) ||
             (bVar3 = ON_SubDEdge::IsSmooth((ON_SubDEdge *)s.m_edge_sharpness), bVar2 != bVar3))
          goto LAB_008ac944;
          if (local_ad != false) {
            bVar3 = ON_SubDEdge::IsSharp((ON_SubDEdge *)s.m_edge_sharpness);
            if (!bVar3) goto LAB_008ac944;
            v = (ON_SubDVertex *)ON_SubDEdgePtr::RelativeSharpness((ON_SubDEdgePtr *)&e,false);
            dVar7 = ON_SubDEdgeSharpness::EndSharpness
                              ((ON_SubDEdgeSharpness *)((long)&eptr.m_ptr + 4),1);
            dVar8 = ON_SubDEdgeSharpness::EndSharpness((ON_SubDEdgeSharpness *)&v,0);
            if (dVar7 != dVar8) goto LAB_008ac944;
            stack0xffffffffffffff84 = (float  [2])v;
          }
          ON_SimpleArray<ON_SubDEdgePtr>::Append(refined_edge_chains,(ON_SubDEdgePtr *)&e);
          this_00 = ON_SubDEdgePtr::RelativeVertex((ON_SubDEdgePtr *)&e,1);
          if (this_00 == (ON_SubDVertex *)0x0) {
            eptr0.m_ptr._4_4_ = eptr0.m_ptr._4_4_ + 1;
            goto LAB_008ac944;
          }
          if (!bVar2) break;
          if (bOrdinarySmoothChains) {
            bVar3 = ON_SubDVertex::IsSmooth(this_00);
            if (!bVar3) {
              eptr0.m_ptr._4_4_ = eptr0.m_ptr._4_4_ + 1;
              goto LAB_008ac944;
            }
            if ((local_ad == false) && (this_00->m_edge_count != 4)) {
              eptr0.m_ptr._4_4_ = eptr0.m_ptr._4_4_ + 1;
              goto LAB_008ac944;
            }
          }
        }
      } while ((!bOrdinaryCreaseChains) || (bVar3 = ON_SubDVertex::IsCrease(this_00), bVar3));
      eptr0.m_ptr._4_4_ = eptr0.m_ptr._4_4_ + 1;
LAB_008ac944:
      i0 = i0 + 1;
      ON_SimpleArray<ON_SubDEdgePtr>::Append(refined_edge_chains,&ON_SubDEdgePtr::Null);
    }
    if ((uint)eptr0.m_ptr < eptr0.m_ptr._4_4_) {
      local_c4 = eptr0.m_ptr._4_4_;
    }
    else {
      local_c4 = (uint)eptr0.m_ptr + 1;
    }
    eptr0.m_ptr._0_4_ = local_c4;
  } while( true );
}

Assistant:

unsigned ON_SubDEdgeChain::RefineEdgeChains(
  const ON_SimpleArray<ON_SubDEdgePtr>& unconditional_edge_chains,
  bool bOrdinarySmoothChains,
  bool bOrdinaryCreaseChains,
  ON_SimpleArray<ON_SubDEdgePtr>& refined_edge_chains
)
{
  const unsigned unconditional_edge_count = unconditional_edge_chains.UnsignedCount();

  if (unconditional_edge_count > 0 && unconditional_edge_chains.Array() == refined_edge_chains.Array())
  {
    // copy unconditional_edge_chains[] to a local array so we can modify refined_edge_chains[]
    const ON_SimpleArray<ON_SubDEdgePtr> local_unconditional_edge_chains(unconditional_edge_chains);
    refined_edge_chains.SetCount(0); // In this uniquecase we do not append because in[ut array = output array.
    return ON_SubDEdgeChain::RefineEdgeChains(
      local_unconditional_edge_chains,
      bOrdinarySmoothChains,
      bOrdinaryCreaseChains,
      refined_edge_chains
    );
  }

  if (refined_edge_chains.UnsignedCount() > 0 && refined_edge_chains.Last()->IsNotNull())
  {
    // Append a null separator to refined_edge_chains[].
    refined_edge_chains.Append(ON_SubDEdgePtr::Null);
  }

  unsigned int refined_chain_count = 0;
  unsigned i1 = 0U;
  for (unsigned i0 = 0; i0 < unconditional_edge_count; i0 = (i0 < i1) ? i1 : (i0 + 1U))
  {
    const ON_SubDEdgePtr eptr0 = unconditional_edge_chains[i0];
    const ON_SubDEdge* e0 = eptr0.Edge();
    if (nullptr == e0)
      continue;

    refined_edge_chains.Append(eptr0);

    const unsigned short edge_face_count = e0->m_face_count;
    const bool bSmoothChain = e0->IsSmooth();
    const bool bSharpChain = bSmoothChain ? e0->IsSharp() : false;
    ON_SubDEdgeSharpness prev_sharpness = bSharpChain ? eptr0.RelativeSharpness(false) : ON_SubDEdgeSharpness::Smooth;

    for (i1 = i0 + 1; i1 < unconditional_edge_count; ++i1)
    {
      const ON_SubDEdgePtr eptr = unconditional_edge_chains[i1];
      const ON_SubDEdge* e = eptr.Edge();
      if (nullptr == e)
        break;
      if (edge_face_count != e->m_face_count)
        break;
      if (bSmoothChain != e->IsSmooth())
        break;
      if (bSharpChain)
      {
        if (false == e->IsSharp())
          break;
        const ON_SubDEdgeSharpness s = eptr.RelativeSharpness(false);
        if (false == (prev_sharpness.EndSharpness(1) == s.EndSharpness(0)))
          break;
        prev_sharpness = s;
      }

      // Add eptr to current chain
      refined_edge_chains.Append(eptr);

      const ON_SubDVertex* v = eptr.RelativeVertex(1);
      if (nullptr == v)
      {
        ++i1;
        break;
      }

      if (bSmoothChain)
      {
        if (false == bOrdinarySmoothChains)
          continue;
        if (false == v->IsSmooth())
        {
          ++i1;
          break;
        }        
        if (false == bSharpChain && 4 != v->m_edge_count)
        {
          ++i1;
          break;
        }
      }
      else
      {
        if (false == bOrdinaryCreaseChains)
          continue;
        if (false == v->IsCrease())
        {
          ++i1;
          break;
        }
      }
    }

    // finished with this chain.
    ++refined_chain_count;
    refined_edge_chains.Append(ON_SubDEdgePtr::Null);
  }

  return refined_chain_count;
}